

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

void gost_cnt_next(void *ctx,uchar *iv,uchar *buf)

{
  uint uVar1;
  undefined8 *in_RSI;
  gost_ctx *in_RDI;
  gost_ctx *unaff_retaddr;
  uchar buf1 [8];
  word32 go;
  word32 g;
  ossl_gost_cipher_ctx *c;
  byte *in_stack_ffffffffffffffd0;
  uint uVar2;
  byte *out;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  if ((in_RDI->master_key[2] != 0) && (in_RDI->master_key[1] == 0x400)) {
    cryptopro_key_meshing(unaff_retaddr,(uchar *)in_RDI);
  }
  if (in_RDI->master_key[1] == 0) {
    gostcrypt(in_RDI,(byte *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
              in_stack_ffffffffffffffd0);
  }
  else {
    in_stack_ffffffffffffffd0 = (byte *)*in_RSI;
  }
  uVar2 = (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  uVar1 = uVar2 + 0x1010104;
  if (uVar1 < uVar2) {
    uVar1 = uVar2 + 0x1010105;
  }
  out = (byte *)CONCAT17((char)(uVar1 >> 0x18),
                         CONCAT16((char)(uVar1 >> 0x10),
                                  CONCAT15((char)(uVar1 >> 8),
                                           CONCAT14((char)uVar1,
                                                    (int)in_stack_ffffffffffffffd0 + 0x1010101))));
  *in_RSI = out;
  gostcrypt(in_RDI,(byte *)CONCAT44(uVar1,uVar2),out);
  in_RDI->master_key[1] = (in_RDI->master_key[1] & 0x3ff) + 8;
  return;
}

Assistant:

static void gost_cnt_next(void *ctx, unsigned char *iv, unsigned char *buf)
{
    struct ossl_gost_cipher_ctx *c = ctx;
    word32 g, go;
    unsigned char buf1[8];
    assert(c->count % 8 == 0 && c->count <= 1024);
    if (c->key_meshing && c->count == 1024) {
        cryptopro_key_meshing(&(c->cctx), iv);
    }
    if (c->count == 0) {
        gostcrypt(&(c->cctx), iv, buf1);
    } else {
        memcpy(buf1, iv, 8);
    }
    g = buf1[0] | (buf1[1] << 8) | (buf1[2] << 16) | ((word32) buf1[3] << 24);
    g += 0x01010101;
    buf1[0] = (unsigned char)(g & 0xff);
    buf1[1] = (unsigned char)((g >> 8) & 0xff);
    buf1[2] = (unsigned char)((g >> 16) & 0xff);
    buf1[3] = (unsigned char)((g >> 24) & 0xff);
    g = buf1[4] | (buf1[5] << 8) | (buf1[6] << 16) | ((word32) buf1[7] << 24);
    go = g;
    g += 0x01010104;
    if (go > g)                 /* overflow */
        g++;
    buf1[4] = (unsigned char)(g & 0xff);
    buf1[5] = (unsigned char)((g >> 8) & 0xff);
    buf1[6] = (unsigned char)((g >> 16) & 0xff);
    buf1[7] = (unsigned char)((g >> 24) & 0xff);
    memcpy(iv, buf1, 8);
    gostcrypt(&(c->cctx), buf1, buf);
    c->count = c->count % 1024 + 8;
}